

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void ImportModuleDependencies
               (ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx,
               ByteCode *moduleBytecode)

{
  int iVar1;
  char *pcVar2;
  ExternModuleInfo *pEVar3;
  size_t sVar4;
  ModuleData **val;
  ByteCode *pBVar5;
  Lexeme *lexStart;
  undefined4 extraout_var;
  Lexer *this;
  ulong uVar7;
  uint *puVar8;
  SmallDenseMap<InplaceStr,_ModuleData_*,_InplaceStrHasher,_128U> *this_00;
  char *__s;
  ModuleData *moduleData;
  uint lexStreamSize;
  ExpressionContext *local_88;
  ByteCode *local_80;
  SynBase *local_78;
  SmallDenseMap<InplaceStr,_ModuleData_*,_InplaceStrHasher,_128U> *local_70;
  ModuleContext *local_68;
  InplaceStr local_60;
  char *local_50;
  SmallArray<ModuleData_*,_128U> *local_48;
  TraceScope traceScope;
  ModuleData *pMVar6;
  undefined4 extraout_var_00;
  
  local_88 = ctx;
  local_80 = moduleBytecode;
  local_78 = source;
  local_68 = moduleCtx;
  if (ImportModuleDependencies(ExpressionContext&,SynBase*,ModuleContext&,ByteCode*)::token == '\0')
  {
    iVar1 = __cxa_guard_acquire(&ImportModuleDependencies(ExpressionContext&,SynBase*,ModuleContext&,ByteCode*)
                                 ::token);
    if (iVar1 != 0) {
      ImportModuleDependencies::token = NULLC::TraceGetToken("analyze","ImportModuleDependencies");
      __cxa_guard_release(&ImportModuleDependencies(ExpressionContext&,SynBase*,ModuleContext&,ByteCode*)
                           ::token);
      moduleBytecode = local_80;
    }
  }
  NULLC::TraceScope::TraceScope(&traceScope,ImportModuleDependencies::token);
  pcVar2 = FindSymbols(moduleBytecode);
  pEVar3 = FindFirstModule(moduleBytecode);
  this_00 = &local_88->uniqueDependencyMap;
  local_48 = &local_88->uniqueDependencies;
  puVar8 = &pEVar3->nameOffset;
  uVar7 = 0;
  local_70 = this_00;
  local_50 = pcVar2;
  do {
    if (moduleBytecode->dependsCount <= uVar7) {
      NULLC::TraceScope::~TraceScope(&traceScope);
      return;
    }
    __s = pcVar2 + *puVar8;
    local_60.begin = __s;
    sVar4 = strlen(__s);
    local_60.end = __s + sVar4;
    val = SmallDenseMap<InplaceStr,_ModuleData_*,_InplaceStrHasher,_128U>::find(this_00,&local_60);
    if (val == (ModuleData **)0x0) {
      pBVar5 = (ByteCode *)BinaryCache::FindBytecode(__s,false);
      if (pBVar5 == (ByteCode *)0x0) {
        anon_unknown.dwarf_ff84f::Stop
                  (local_88,local_78,"ERROR: module dependency import is not implemented");
      }
      lexStreamSize = 0;
      lexStart = BinaryCache::FindLexems(__s,false,&lexStreamSize);
      iVar1 = (*local_88->allocator->_vptr_Allocator[2])(local_88->allocator,0x48);
      pMVar6 = (ModuleData *)CONCAT44(extraout_var,iVar1);
      sVar4 = strlen(__s);
      pMVar6->source = local_78;
      (pMVar6->name).begin = __s;
      (pMVar6->name).end = __s + sVar4;
      pMVar6->importIndex = 0;
      pMVar6->bytecode = (ByteCode *)0x0;
      pMVar6->lexer = (Lexer *)0x0;
      pMVar6->lexStream = (Lexeme *)0x0;
      pMVar6->lexStreamSize = 0;
      pMVar6->startingFunctionIndex = 0;
      pMVar6->importedFunctionCount = 0;
      pMVar6->moduleFunctionCount = 0;
      moduleData = pMVar6;
      SmallArray<ModuleData_*,_32U>::push_back(&local_68->dependencies,&moduleData);
      SmallArray<ModuleData_*,_128U>::push_back(local_48,&moduleData);
      local_60.begin = __s;
      sVar4 = strlen(__s);
      this_00 = local_70;
      local_60.end = __s + sVar4;
      SmallDenseMap<InplaceStr,_ModuleData_*,_InplaceStrHasher,_128U>::insert
                (local_70,&local_60,&moduleData);
      moduleData->bytecode = pBVar5;
      if (lexStart == (Lexeme *)0x0) {
        iVar1 = (*local_88->allocator->_vptr_Allocator[2])(local_88->allocator,0x420);
        this = (Lexer *)CONCAT44(extraout_var_00,iVar1);
        Lexer::Lexer(this,local_88->allocator);
        moduleData->lexer = this;
        pcVar2 = FindSource(moduleData->bytecode);
        Lexer::Lexify(this,pcVar2);
        lexStart = Lexer::GetStreamStart(moduleData->lexer);
        lexStreamSize = Lexer::GetStreamSize(moduleData->lexer);
        BinaryCache::PutLexemes(__s,lexStart,lexStreamSize);
        this_00 = local_70;
      }
      moduleData->lexStream = lexStart;
      moduleData->lexStreamSize = lexStreamSize;
      pcVar2 = local_50;
      moduleBytecode = local_80;
    }
    else {
      SmallArray<ModuleData_*,_32U>::push_back(&local_68->dependencies,val);
    }
    uVar7 = uVar7 + 1;
    puVar8 = puVar8 + 7;
  } while( true );
}

Assistant:

void ImportModuleDependencies(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx, ByteCode *moduleBytecode)
{
	TRACE_SCOPE("analyze", "ImportModuleDependencies");

	char *symbols = FindSymbols(moduleBytecode);

	ExternModuleInfo *moduleList = FindFirstModule(moduleBytecode);

	for(unsigned i = 0; i < moduleBytecode->dependsCount; i++)
	{
		ExternModuleInfo &moduleInfo = moduleList[i];

		const char *moduleFileName = symbols + moduleInfo.nameOffset;

		if(ModuleData **uniqueModuleData = ctx.uniqueDependencyMap.find(InplaceStr(moduleFileName)))
		{
			moduleCtx.dependencies.push_back(*uniqueModuleData);
			continue;
		}

		const char *bytecode = BinaryCache::FindBytecode(moduleFileName, false);

		if(!bytecode)
			Stop(ctx, source, "ERROR: module dependency import is not implemented");

		unsigned lexStreamSize = 0;
		Lexeme *lexStream = BinaryCache::FindLexems(moduleFileName, false, lexStreamSize);

		ModuleData *moduleData = new (ctx.get<ModuleData>()) ModuleData(source, InplaceStr(moduleFileName));

		moduleCtx.dependencies.push_back(moduleData);

		ctx.uniqueDependencies.push_back(moduleData);
		ctx.uniqueDependencyMap.insert(InplaceStr(moduleFileName), moduleData);

		moduleData->bytecode = (ByteCode*)bytecode;

		if(!lexStream)
		{
			moduleData->lexer = new (ctx.get<Lexer>()) Lexer(ctx.allocator);

			moduleData->lexer->Lexify(FindSource(moduleData->bytecode));
			lexStream = moduleData->lexer->GetStreamStart();
			lexStreamSize = moduleData->lexer->GetStreamSize();

			BinaryCache::PutLexemes(moduleFileName, lexStream, lexStreamSize);
		}

		moduleData->lexStream = lexStream;
		moduleData->lexStreamSize = lexStreamSize;
	}
}